

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffBinary(NodeDiffComputer *this,BinExpr *lhs,BinExpr *rhs)

{
  int32_t iVar1;
  Node *rhs_00;
  BinExpr *in_RDX;
  BinExpr *in_RSI;
  Node *in_RDI;
  int32_t diffRight;
  int32_t diffLeft;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int32_t local_4;
  
  rhs_00 = &BinExpr::lhs(in_RSI)->super_Node;
  BinExpr::lhs(in_RDX);
  iVar1 = diffNodes((NodeDiffComputer *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI,rhs_00);
  local_4 = iVar1;
  if (iVar1 <= in_RDI[1]._coordinates.columnStart) {
    BinExpr::rhs(in_RSI);
    BinExpr::rhs(in_RDX);
    local_4 = diffNodes((NodeDiffComputer *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),in_RDI,rhs_00)
    ;
    if (local_4 <= in_RDI[1]._coordinates.columnStart) {
      local_4 = iVar1 + local_4;
    }
  }
  return local_4;
}

Assistant:

int32_t diffBinary(const BinExpr *lhs, const BinExpr *rhs) {
    assert(lhs->op() == rhs->op());

    int32_t diffLeft = diffNodes(lhs->lhs(), rhs->lhs());

    if (diffLeft > limit)
      return diffLeft;

    int32_t diffRight = diffNodes(lhs->rhs(), rhs->rhs());

    if (diffRight > limit)
      return diffRight;

    return diffLeft + diffRight;
  }